

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_packed_varyings.cpp
# Opt level: O1

uint __thiscall
anon_unknown.dwarf_188f07::lower_packed_varyings_visitor::lower_rvalue
          (lower_packed_varyings_visitor *this,ir_rvalue *rvalue,uint fine_location,
          ir_variable *unpacked_var,char *name,bool gs_input_toplevel,uint vertex_index)

{
  uint *puVar1;
  char cVar2;
  deref lhs;
  deref lhs_00;
  deref lhs_01;
  lower_packed_varyings_visitor *plVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ir_dereference_record *this_00;
  char *pcVar6;
  ir_swizzle *this_01;
  ir_swizzle *this_02;
  undefined4 extraout_var_00;
  char *name_00;
  glsl_type *pgVar7;
  ir_variable *piVar8;
  ir_dereference_array *this_03;
  ir_constant *this_04;
  ir_dereference_array *this_05;
  undefined4 extraout_var_01;
  operand oVar9;
  undefined4 extraout_var_02;
  operand a;
  undefined4 extraout_var_04;
  operand a_00;
  operand a_01;
  operand a_02;
  operand a_03;
  operand a_04;
  operand a_05;
  operand oVar10;
  ir_assignment *piVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  exec_node *peVar17;
  exec_node *peVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  exec_list *peVar23;
  glsl_type *t;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ir_expression_operation iVar27;
  int iVar28;
  uint uVar29;
  char right_swizzle_name [4];
  char left_swizzle_name [4];
  uint right_swizzle_values [4];
  uint swizzle_values [4];
  deref local_90;
  deref local_88;
  ir_variable *local_80;
  lower_packed_varyings_visitor *local_78;
  ir_swizzle *local_70;
  deref local_68;
  undefined8 uStack_60;
  uint local_4c;
  uint local_48 [6];
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  pgVar7 = rvalue->type;
  uVar25 = *(uint *)&pgVar7->field_0x4 & 0xff;
  bVar12 = 0;
  if ((byte)(uVar25 - 4) < 10) {
    bVar12 = (byte)(&DAT_00230e0c)[uVar25 - 4 & 0xff];
  }
  if (gs_input_toplevel && uVar25 != 0x11) {
    __assert_fail("!gs_input_toplevel || rvalue->type->is_array()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x20d,
                  "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
                 );
  }
  if (uVar25 == 0x11) {
    uVar20 = pgVar7->length;
LAB_001f2d2f:
    uVar25 = lower_arraylike(this,rvalue,uVar20,fine_location,unpacked_var,name,gs_input_toplevel,
                             vertex_index);
    return uVar25;
  }
  if (uVar25 == 0xf) {
    if (rvalue->type->length == 0) {
      return fine_location;
    }
    lVar22 = 0;
    uVar24 = 0;
    local_80 = unpacked_var;
    do {
      local_70 = (ir_swizzle *)CONCAT44(local_70._4_4_,fine_location);
      if (lVar22 != 0) {
        iVar5 = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
        rvalue = (ir_rvalue *)CONCAT44(extraout_var,iVar5);
      }
      pcVar6 = *(char **)(&((rvalue->type->fields).array)->vector_elements + lVar22);
      this_00 = (ir_dereference_record *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_dereference_record::ir_dereference_record(this_00,rvalue,pcVar6);
      pcVar6 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,pcVar6);
      fine_location =
           lower_rvalue(this,(ir_rvalue *)this_00,(uint)local_70,local_80,pcVar6,false,vertex_index)
      ;
      uVar24 = uVar24 + 1;
      lVar22 = lVar22 + 0x30;
    } while (uVar24 < rvalue->type->length);
    return fine_location;
  }
  uVar20 = (uint)pgVar7->matrix_columns;
  if (uVar25 - 2 < 3 && 1 < uVar20) {
    gs_input_toplevel = false;
    goto LAB_001f2d2f;
  }
  uVar25 = fine_location & 3;
  if (4 < ((uint)pgVar7->vector_elements << (bVar12 & 0x1f)) + uVar25) {
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_68.val = (ir_dereference *)0x0;
    uStack_60 = 0;
    bVar12 = 0;
    local_88.val._0_4_ = 0;
    local_90.val._0_4_ = 0;
    uVar25 = 4 - uVar25;
    bVar19 = pgVar7->field_0x4 - 4;
    if (bVar19 < 10) {
      bVar12 = (byte)(&DAT_00230e0c)[bVar19];
    }
    bVar12 = bVar12 & 0x1f;
    uVar20 = uVar25 >> bVar12;
    bVar19 = pgVar7->vector_elements;
    if (uVar25 >> bVar12 != 0) {
      memcpy(&local_88,"xyzw",(ulong)uVar20);
      uVar24 = 0;
      do {
        local_48[uVar24] = (uint)uVar24;
        uVar24 = uVar24 + 1;
      } while (uVar20 != uVar24);
    }
    uVar29 = bVar19 - uVar20;
    local_80 = unpacked_var;
    if (uVar29 != 0) {
      uVar24 = 0;
      do {
        uVar26 = (int)uVar24 + uVar20;
        *(uint *)((long)&local_68.val + uVar24 * 4) = uVar26;
        *(char *)((long)&local_90.val + uVar24) = "xyzw"[uVar26];
        uVar24 = uVar24 + 1;
      } while (uVar29 != uVar24);
    }
    this_01 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
    ir_swizzle::ir_swizzle(this_01,rvalue,local_48,uVar20);
    this_02 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
    iVar5 = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
    local_70 = this_02;
    ir_swizzle::ir_swizzle
              (this_02,(ir_rvalue *)CONCAT44(extraout_var_00,iVar5),(uint *)&local_68,uVar29);
    pcVar6 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,&local_88);
    name_00 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,&local_90);
    piVar8 = local_80;
    if (uVar25 >> bVar12 == 0) {
      uVar25 = fine_location + 1;
    }
    else {
      uVar25 = lower_rvalue(this,(ir_rvalue *)this_01,fine_location,local_80,pcVar6,false,
                            vertex_index);
    }
    uVar25 = lower_rvalue(this,&local_70->super_ir_rvalue,uVar25,piVar8,name_00,false,vertex_index);
    return uVar25;
  }
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_4c = (uint)pgVar7->vector_elements;
  uVar20 = local_4c << (bVar12 & 0x1f);
  local_70 = (ir_swizzle *)CONCAT44(local_70._4_4_,fine_location);
  if (pgVar7->vector_elements != 0) {
    uVar24 = 0;
    do {
      local_48[uVar24] = (int)uVar24 + uVar25;
      uVar24 = uVar24 + 1;
    } while (uVar20 + (uVar20 == 0) != uVar24);
  }
  uVar29 = (fine_location >> 2) - 0x20;
  if (this->locations_used <= uVar29) {
    __assert_fail("slot < locations_used",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,700,
                  "ir_dereference *(anonymous namespace)::lower_packed_varyings_visitor::get_packed_varying_deref(unsigned int, ir_variable *, const char *, unsigned int)"
                 );
  }
  piVar8 = this->packed_varyings[uVar29];
  local_78 = this;
  if (piVar8 == (ir_variable *)0x0) {
    pcVar6 = ralloc_asprintf(this->mem_ctx,"packed:%s",name);
    if (this->components[uVar29] == '\0') {
      __assert_fail("components[slot] != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x2c0,
                    "ir_dereference *(anonymous namespace)::lower_packed_varyings_visitor::get_packed_varying_deref(unsigned int, ir_variable *, const char *, unsigned int)"
                   );
    }
    uVar26 = 1;
    if ((((undefined1  [44])unpacked_var->data & (undefined1  [44])0x30000) !=
         (undefined1  [44])0x20000) &&
       (bVar4 = glsl_type::contains_integer(unpacked_var->type), !bVar4)) {
      bVar4 = glsl_type::contains_double(unpacked_var->type);
      uVar26 = 2 - bVar4;
    }
    plVar3 = local_78;
    local_80 = unpacked_var;
    pgVar7 = glsl_type::get_instance(uVar26,(uint)local_78->components[uVar29],1,0,false);
    if (plVar3->gs_input_vertices != 0) {
      pgVar7 = glsl_type::get_array_instance(pgVar7,plVar3->gs_input_vertices,0);
    }
    plVar3 = local_78;
    piVar8 = (ir_variable *)exec_node::operator_new(0x90,local_78->mem_ctx);
    ir_variable::ir_variable(piVar8,pgVar7,pcVar6,plVar3->mode);
    uVar26 = plVar3->gs_input_vertices;
    if (uVar26 != 0) {
      (piVar8->data).max_array_access = uVar26 - 1;
    }
    uVar13 = *(uint *)&local_80->data & 2;
    uVar26 = *(uint *)&piVar8->data;
    *(uint *)&piVar8->data = uVar26 & 0xfffffffd | uVar13;
    uVar14 = *(uint *)&local_80->data & 4;
    *(uint *)&piVar8->data = uVar26 & 0xfffffff9 | uVar13 | uVar14;
    uVar15 = *(uint *)&local_80->data & 8;
    *(uint *)&piVar8->data = uVar26 & 0xfffffff1 | uVar13 | uVar14 | uVar15;
    for (; pgVar7->field_0x4 == '\x11'; pgVar7 = (pgVar7->fields).array) {
    }
    if (pgVar7 == &glsl_type::_ivec4_type) {
      uVar16 = 0x20000;
    }
    else {
      uVar16 = *(uint *)&local_80->data & 0x30000;
    }
    *(uint *)&piVar8->data = uVar26 & 0xfffcfff1 | uVar13 | uVar14 | uVar15 | uVar16;
    (piVar8->data).location = fine_location >> 2;
    *(ushort *)&(piVar8->data).field_0x4 =
         (ushort)*(undefined4 *)&(piVar8->data).field_0x4 & 0xff9f |
         *(ushort *)&(local_80->data).field_0x4 & 0x60;
    *(uint *)&piVar8->data =
         uVar26 & 0xfffcfdf1 | uVar13 | uVar14 | uVar15 | uVar16 | *(uint *)&local_80->data & 0x200;
    (piVar8->data).stream = 0x80000000;
    peVar17 = &(piVar8->super_ir_instruction).super_exec_node;
    (piVar8->super_ir_instruction).super_exec_node.next =
         &(local_80->super_ir_instruction).super_exec_node;
    (piVar8->super_ir_instruction).super_exec_node.prev =
         (local_80->super_ir_instruction).super_exec_node.prev;
    ((local_80->super_ir_instruction).super_exec_node.prev)->next = peVar17;
    (local_80->super_ir_instruction).super_exec_node.prev = peVar17;
    local_78->packed_varyings[uVar29] = piVar8;
    unpacked_var = local_80;
  }
  else {
    *(uint *)&piVar8->data = *(uint *)&piVar8->data | *(uint *)&unpacked_var->data & 0x200;
    if ((vertex_index == 0) || (this->gs_input_vertices == 0)) {
      pcVar6 = piVar8->name;
      if (pcVar6 == piVar8->name_storage || pcVar6 == "compiler_temp") {
        pcVar6 = ralloc_asprintf(piVar8,"%s,%s",pcVar6,name);
        piVar8->name = pcVar6;
      }
      else {
        ralloc_asprintf_append(&piVar8->name,",%s",name);
      }
    }
  }
  plVar3 = local_78;
  this_03 = (ir_dereference_array *)exec_node::operator_new(0x30,local_78->mem_ctx);
  ir_dereference_variable::ir_dereference_variable
            ((ir_dereference_variable *)this_03,plVar3->packed_varyings[uVar29]);
  this_05 = this_03;
  if (plVar3->gs_input_vertices != 0) {
    this_04 = (ir_constant *)exec_node::operator_new(0xb0,plVar3->mem_ctx);
    ir_constant::ir_constant(this_04,vertex_index,1);
    this_05 = (ir_dereference_array *)exec_node::operator_new(0x38,plVar3->mem_ctx);
    ir_dereference_array::ir_dereference_array(this_05,(ir_rvalue *)this_03,(ir_rvalue *)this_04);
  }
  uVar29 = (unpacked_var->data).stream;
  if (uVar29 != 0) {
    if (3 < uVar29) {
      __assert_fail("unpacked_var->data.stream < 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x267,
                    "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
                   );
    }
    iVar5 = (*(this_05->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
              _vptr_ir_instruction[8])(this_05);
    if ((char)local_4c != '\0') {
      iVar21 = uVar20 + (uVar20 == 0);
      iVar28 = uVar25 * 2;
      do {
        puVar1 = (uint *)(CONCAT44(extraout_var_01,iVar5) + 0x58);
        *puVar1 = *puVar1 | (unpacked_var->data).stream << ((byte)iVar28 & 0x1f);
        iVar28 = iVar28 + 2;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
    }
  }
  oVar9.val = (ir_rvalue *)exec_node::operator_new(0x38,plVar3->mem_ctx);
  ir_swizzle::ir_swizzle((ir_swizzle *)oVar9.val,(ir_rvalue *)this_05,local_48,uVar20);
  if (plVar3->mode == ir_var_shader_out) {
    cVar2 = (oVar9.val)->type->field_0x4;
    pgVar7 = rvalue->type;
    oVar10.val = rvalue;
    if (cVar2 == pgVar7->field_0x4) goto LAB_001f3c35;
    if (cVar2 != '\x01') {
      __assert_fail("lhs->type->base_type == GLSL_TYPE_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x14c,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    switch(pgVar7->field_0x4) {
    case 0:
      oVar10.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar3->mem_ctx);
      pgVar7 = (oVar9.val)->type;
      iVar5 = 0x16;
      goto LAB_001f35ee;
    default:
      __assert_fail("!\"Unexpected type conversion while lowering varyings\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x18d,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    case 2:
      oVar10.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar3->mem_ctx);
      pgVar7 = (oVar9.val)->type;
      iVar5 = 0x23;
LAB_001f35ee:
      ir_expression::ir_expression
                ((ir_expression *)oVar10.val,iVar5,pgVar7,rvalue,(ir_rvalue *)0x0,(ir_rvalue *)0x0,
                 (ir_rvalue *)0x0);
      break;
    case 4:
      if (2 < pgVar7->vector_elements) {
        __assert_fail("rhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x157,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar7->vector_elements != 2) {
        iVar27 = ir_unop_unpack_double_2x32;
        goto LAB_001f3c22;
      }
      piVar8 = (ir_variable *)exec_node::operator_new(0x90,plVar3->mem_ctx);
      ir_variable::ir_variable(piVar8,(oVar9.val)->type,"pack",ir_var_temporary);
      if ((oVar9.val)->type->vector_elements != '\x04') {
        __assert_fail("lhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x15b,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = plVar3->out_variables;
      peVar18 = &(piVar8->super_ir_instruction).super_exec_node;
      (piVar8->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar8->super_ir_instruction).super_exec_node.prev = peVar17;
      peVar17->next = peVar18;
      (peVar23->tail_sentinel).prev = peVar18;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_68,piVar8);
      a_00.val._0_4_ =
           (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,plVar3->mem_ctx,0);
      a_00.val._4_4_ = extraout_var_05;
      oVar10.val = &ir_builder::swizzle_x(a_00)->super_ir_rvalue;
      oVar10.val = &ir_builder::expr(ir_unop_unpack_double_2x32,oVar10)->super_ir_rvalue;
      oVar10.val = &ir_builder::u2i(oVar10)->super_ir_rvalue;
      piVar11 = ir_builder::assign(local_68,oVar10,3);
      if (piVar11 != (ir_assignment *)0x0) {
        piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
      }
      (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
      peVar17->next = (exec_node *)piVar11;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_88,piVar8);
      oVar10.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
      iVar27 = ir_unop_unpack_double_2x32;
LAB_001f39b1:
      oVar10.val = &ir_builder::expr(iVar27,oVar10)->super_ir_rvalue;
      oVar10.val = &ir_builder::u2i(oVar10)->super_ir_rvalue;
LAB_001f39c1:
      lhs_00.val._4_4_ = local_88.val._4_4_;
      lhs_00.val._0_4_ = local_88.val._0_4_;
      piVar11 = ir_builder::assign(lhs_00,oVar10,0xc);
      if (piVar11 != (ir_assignment *)0x0) {
        piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
      }
      (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
      peVar17->next = (exec_node *)piVar11;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
      ir_builder::deref::deref(&local_90,piVar8);
      oVar10.val = (ir_rvalue *)CONCAT44(local_90.val._4_4_,local_90.val._0_4_);
      break;
    case 9:
      if (2 < pgVar7->vector_elements) {
        __assert_fail("rhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x177,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar7->vector_elements == 2) {
        piVar8 = (ir_variable *)exec_node::operator_new(0x90,plVar3->mem_ctx);
        ir_variable::ir_variable(piVar8,(oVar9.val)->type,"pack",ir_var_temporary);
        if ((oVar9.val)->type->vector_elements != '\x04') {
          __assert_fail("lhs->type->vector_elements == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                        ,0x17b,
                        "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                       );
        }
        peVar23 = plVar3->out_variables;
        peVar18 = &(piVar8->super_ir_instruction).super_exec_node;
        (piVar8->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
        peVar17 = (peVar23->tail_sentinel).prev;
        (piVar8->super_ir_instruction).super_exec_node.prev = peVar17;
        peVar17->next = peVar18;
        (peVar23->tail_sentinel).prev = peVar18;
        peVar23 = plVar3->out_instructions;
        ir_builder::deref::deref(&local_68,piVar8);
        a_03.val._0_4_ =
             (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,plVar3->mem_ctx,0);
        a_03.val._4_4_ = extraout_var_08;
        oVar10.val = &ir_builder::swizzle_x(a_03)->super_ir_rvalue;
        oVar10.val = &ir_builder::expr(ir_last_unop,oVar10)->super_ir_rvalue;
        oVar10.val = &ir_builder::u2i(oVar10)->super_ir_rvalue;
        piVar11 = ir_builder::assign(local_68,oVar10,3);
        if (piVar11 != (ir_assignment *)0x0) {
          piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
        }
        (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel
        ;
        peVar17 = (peVar23->tail_sentinel).prev;
        (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
        peVar17->next = (exec_node *)piVar11;
        (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
        peVar23 = plVar3->out_instructions;
        ir_builder::deref::deref(&local_88,piVar8);
        oVar10.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
        iVar27 = ir_last_unop;
        goto LAB_001f39b1;
      }
      iVar27 = ir_last_unop;
      goto LAB_001f3c22;
    case 10:
      if (2 < pgVar7->vector_elements) {
        __assert_fail("rhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x167,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar7->vector_elements == 2) {
        piVar8 = (ir_variable *)exec_node::operator_new(0x90,plVar3->mem_ctx);
        ir_variable::ir_variable(piVar8,(oVar9.val)->type,"pack",ir_var_temporary);
        if ((oVar9.val)->type->vector_elements != '\x04') {
          __assert_fail("lhs->type->vector_elements == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                        ,0x16b,
                        "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                       );
        }
        peVar23 = plVar3->out_variables;
        peVar18 = &(piVar8->super_ir_instruction).super_exec_node;
        (piVar8->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
        peVar17 = (peVar23->tail_sentinel).prev;
        (piVar8->super_ir_instruction).super_exec_node.prev = peVar17;
        peVar17->next = peVar18;
        (peVar23->tail_sentinel).prev = peVar18;
        peVar23 = plVar3->out_instructions;
        ir_builder::deref::deref(&local_68,piVar8);
        oVar10.val._0_4_ =
             (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,plVar3->mem_ctx,0);
        oVar10.val._4_4_ = extraout_var_02;
        oVar10.val = &ir_builder::swizzle_x(oVar10)->super_ir_rvalue;
        oVar10.val = &ir_builder::expr(ir_unop_unpack_int_2x32,oVar10)->super_ir_rvalue;
        piVar11 = ir_builder::assign(local_68,oVar10,3);
        if (piVar11 != (ir_assignment *)0x0) {
          piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
        }
        (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel
        ;
        peVar17 = (peVar23->tail_sentinel).prev;
        (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
        peVar17->next = (exec_node *)piVar11;
        (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
        peVar23 = plVar3->out_instructions;
        ir_builder::deref::deref(&local_88,piVar8);
        oVar10.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
        oVar10.val = &ir_builder::expr(ir_unop_unpack_int_2x32,oVar10)->super_ir_rvalue;
        goto LAB_001f39c1;
      }
      oVar10.val = &ir_builder::expr(ir_unop_unpack_int_2x32,rvalue)->super_ir_rvalue;
      break;
    case 0xc:
      iVar27 = ir_unop_unpack_sampler_2x32;
      goto LAB_001f3c22;
    case 0xd:
      iVar27 = ir_unop_unpack_image_2x32;
LAB_001f3c22:
      oVar10.val = &ir_builder::expr(iVar27,rvalue)->super_ir_rvalue;
      oVar10.val = &ir_builder::u2i(oVar10)->super_ir_rvalue;
    }
LAB_001f3c35:
    peVar23 = plVar3->out_instructions;
    piVar11 = (ir_assignment *)exec_node::operator_new(0x40,plVar3->mem_ctx);
    rvalue = oVar9.val;
    goto LAB_001f3c89;
  }
  pgVar7 = rvalue->type;
  cVar2 = (oVar9.val)->type->field_0x4;
  oVar10.val = oVar9.val;
  if (pgVar7->field_0x4 == cVar2) goto LAB_001f3c6c;
  if (cVar2 != '\x01') {
    __assert_fail("rhs->type->base_type == GLSL_TYPE_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x1a4,
                  "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                 );
  }
  switch(pgVar7->field_0x4) {
  case 0:
    oVar10.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar3->mem_ctx);
    pgVar7 = rvalue->type;
    iVar5 = 0x15;
    break;
  default:
    __assert_fail("!\"Unexpected type conversion while lowering varyings\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x1e4,
                  "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                 );
  case 2:
    oVar10.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar3->mem_ctx);
    pgVar7 = rvalue->type;
    iVar5 = 0x22;
    break;
  case 4:
    if (2 < pgVar7->vector_elements) {
      __assert_fail("lhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1af,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar7->vector_elements == 2) {
      piVar8 = (ir_variable *)exec_node::operator_new(0x90,plVar3->mem_ctx);
      ir_variable::ir_variable(piVar8,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar9.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1b2,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = plVar3->out_variables;
      peVar18 = &(piVar8->super_ir_instruction).super_exec_node;
      (piVar8->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar8->super_ir_instruction).super_exec_node.prev = peVar17;
      peVar17->next = peVar18;
      (peVar23->tail_sentinel).prev = peVar18;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_68,piVar8);
      a_01.val._0_4_ =
           (*((oVar9.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar9.val,plVar3->mem_ctx,0);
      a_01.val._4_4_ = extraout_var_06;
      oVar10.val = &ir_builder::swizzle_xy(a_01)->super_ir_rvalue;
      oVar10.val = &ir_builder::i2u(oVar10)->super_ir_rvalue;
      oVar10.val = &ir_builder::expr(ir_unop_pack_double_2x32,oVar10)->super_ir_rvalue;
      piVar11 = ir_builder::assign(local_68,oVar10,1);
      if (piVar11 != (ir_assignment *)0x0) {
        piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
      }
      (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
      peVar17->next = (exec_node *)piVar11;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_88,piVar8);
      a_02.val._0_4_ =
           (*((oVar9.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar9.val,plVar3->mem_ctx,0);
      a_02.val._4_4_ = extraout_var_07;
      oVar9.val = &ir_builder::swizzle(a_02,0x69a,2)->super_ir_rvalue;
      oVar9.val = &ir_builder::i2u(oVar9)->super_ir_rvalue;
      iVar27 = ir_unop_pack_double_2x32;
LAB_001f3b31:
      oVar9.val = &ir_builder::expr(iVar27,oVar9)->super_ir_rvalue;
      lhs_01.val._4_4_ = local_88.val._4_4_;
      lhs_01.val._0_4_ = local_88.val._0_4_;
      piVar11 = ir_builder::assign(lhs_01,oVar9,2);
      if (piVar11 != (ir_assignment *)0x0) {
        piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
      }
      (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
      peVar17->next = (exec_node *)piVar11;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
      ir_builder::deref::deref(&local_90,piVar8);
      oVar10.val = (ir_rvalue *)CONCAT44(local_90.val._4_4_,local_90.val._0_4_);
      goto LAB_001f3c6c;
    }
    oVar9.val = &ir_builder::i2u(oVar9)->super_ir_rvalue;
    iVar27 = ir_unop_pack_double_2x32;
    goto LAB_001f3c64;
  case 9:
    if (2 < pgVar7->vector_elements) {
      __assert_fail("lhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1cd,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar7->vector_elements == 2) {
      piVar8 = (ir_variable *)exec_node::operator_new(0x90,plVar3->mem_ctx);
      ir_variable::ir_variable(piVar8,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar9.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1d0,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = plVar3->out_variables;
      peVar18 = &(piVar8->super_ir_instruction).super_exec_node;
      (piVar8->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar8->super_ir_instruction).super_exec_node.prev = peVar17;
      peVar17->next = peVar18;
      (peVar23->tail_sentinel).prev = peVar18;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_68,piVar8);
      a_04.val._0_4_ =
           (*((oVar9.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar9.val,plVar3->mem_ctx,0);
      a_04.val._4_4_ = extraout_var_09;
      oVar10.val = &ir_builder::swizzle_xy(a_04)->super_ir_rvalue;
      oVar10.val = &ir_builder::i2u(oVar10)->super_ir_rvalue;
      oVar10.val = &ir_builder::expr(ir_unop_pack_uint_2x32,oVar10)->super_ir_rvalue;
      piVar11 = ir_builder::assign(local_68,oVar10,1);
      if (piVar11 != (ir_assignment *)0x0) {
        piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
      }
      (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
      peVar17->next = (exec_node *)piVar11;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_88,piVar8);
      a_05.val._0_4_ =
           (*((oVar9.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar9.val,plVar3->mem_ctx,0);
      a_05.val._4_4_ = extraout_var_10;
      oVar9.val = &ir_builder::swizzle(a_05,0x69a,2)->super_ir_rvalue;
      oVar9.val = &ir_builder::i2u(oVar9)->super_ir_rvalue;
      iVar27 = ir_unop_pack_uint_2x32;
      goto LAB_001f3b31;
    }
    oVar9.val = &ir_builder::i2u(oVar9)->super_ir_rvalue;
    iVar27 = ir_unop_pack_uint_2x32;
    goto LAB_001f3c64;
  case 10:
    if (2 < pgVar7->vector_elements) {
      __assert_fail("lhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1be,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar7->vector_elements == 2) {
      piVar8 = (ir_variable *)exec_node::operator_new(0x90,plVar3->mem_ctx);
      ir_variable::ir_variable(piVar8,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar9.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = plVar3->out_variables;
      peVar18 = &(piVar8->super_ir_instruction).super_exec_node;
      (piVar8->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar8->super_ir_instruction).super_exec_node.prev = peVar17;
      peVar17->next = peVar18;
      (peVar23->tail_sentinel).prev = peVar18;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_68,piVar8);
      a.val._0_4_ = (*((oVar9.val)->super_ir_instruction)._vptr_ir_instruction[4])
                              (oVar9.val,plVar3->mem_ctx,0);
      a.val._4_4_ = extraout_var_03;
      oVar10.val = &ir_builder::swizzle_xy(a)->super_ir_rvalue;
      oVar10.val = &ir_builder::expr(ir_unop_pack_int_2x32,oVar10)->super_ir_rvalue;
      piVar11 = ir_builder::assign(local_68,oVar10,1);
      if (piVar11 != (ir_assignment *)0x0) {
        piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
      }
      (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
      peVar17->next = (exec_node *)piVar11;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
      peVar23 = plVar3->out_instructions;
      ir_builder::deref::deref(&local_88,piVar8);
      oVar9.val._0_4_ =
           (*((oVar9.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar9.val,plVar3->mem_ctx,0);
      oVar9.val._4_4_ = extraout_var_04;
      oVar9.val = &ir_builder::swizzle(oVar9,0x69a,2)->super_ir_rvalue;
      oVar9.val = &ir_builder::expr(ir_unop_pack_int_2x32,oVar9)->super_ir_rvalue;
      lhs.val._4_4_ = local_88.val._4_4_;
      lhs.val._0_4_ = local_88.val._0_4_;
      piVar11 = ir_builder::assign(lhs,oVar9,2);
      if (piVar11 != (ir_assignment *)0x0) {
        piVar11 = (ir_assignment *)&(piVar11->super_ir_instruction).super_exec_node;
      }
      (piVar11->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar17 = (peVar23->tail_sentinel).prev;
      (piVar11->super_ir_instruction).super_exec_node.next = peVar17;
      peVar17->next = (exec_node *)piVar11;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar11;
      ir_builder::deref::deref(&local_90,piVar8);
      oVar10.val = (ir_rvalue *)CONCAT44(local_90.val._4_4_,local_90.val._0_4_);
      goto LAB_001f3c6c;
    }
    iVar27 = ir_unop_pack_int_2x32;
LAB_001f3c64:
    oVar10.val = &ir_builder::expr(iVar27,oVar9)->super_ir_rvalue;
    goto LAB_001f3c6c;
  case 0xc:
    oVar10.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar3->mem_ctx);
    pgVar7 = rvalue->type;
    oVar9.val = &ir_builder::i2u(oVar9)->super_ir_rvalue;
    iVar5 = 0x5e;
    break;
  case 0xd:
    oVar10.val = (ir_rvalue *)exec_node::operator_new(0x58,plVar3->mem_ctx);
    pgVar7 = rvalue->type;
    oVar9.val = &ir_builder::i2u(oVar9)->super_ir_rvalue;
    iVar5 = 0x5f;
  }
  ir_expression::ir_expression
            ((ir_expression *)oVar10.val,iVar5,pgVar7,oVar9.val,(ir_rvalue *)0x0,(ir_rvalue *)0x0,
             (ir_rvalue *)0x0);
LAB_001f3c6c:
  peVar23 = plVar3->out_instructions;
  piVar11 = (ir_assignment *)exec_node::operator_new(0x40,plVar3->mem_ctx);
LAB_001f3c89:
  ir_assignment::ir_assignment(piVar11,rvalue,oVar10.val,(ir_rvalue *)0x0);
  peVar17 = &(piVar11->super_ir_instruction).super_exec_node;
  (piVar11->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
  peVar18 = (peVar23->tail_sentinel).prev;
  (piVar11->super_ir_instruction).super_exec_node.prev = peVar18;
  peVar18->next = peVar17;
  (peVar23->tail_sentinel).prev = peVar17;
  return (uint)local_70 + uVar20;
}

Assistant:

unsigned
lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *rvalue,
                                            unsigned fine_location,
                                            ir_variable *unpacked_var,
                                            const char *name,
                                            bool gs_input_toplevel,
                                            unsigned vertex_index)
{
   unsigned dmul = rvalue->type->is_64bit() ? 2 : 1;
   /* When gs_input_toplevel is set, we should be looking at a geometry shader
    * input array.
    */
   assert(!gs_input_toplevel || rvalue->type->is_array());

   if (rvalue->type->is_struct()) {
      for (unsigned i = 0; i < rvalue->type->length; i++) {
         if (i != 0)
            rvalue = rvalue->clone(this->mem_ctx, NULL);
         const char *field_name = rvalue->type->fields.structure[i].name;
         ir_dereference_record *dereference_record = new(this->mem_ctx)
            ir_dereference_record(rvalue, field_name);
         char *deref_name
            = ralloc_asprintf(this->mem_ctx, "%s.%s", name, field_name);
         fine_location = this->lower_rvalue(dereference_record, fine_location,
                                            unpacked_var, deref_name, false,
                                            vertex_index);
      }
      return fine_location;
   } else if (rvalue->type->is_array()) {
      /* Arrays are packed/unpacked by considering each array element in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->array_size(),
                                   fine_location, unpacked_var, name,
                                   gs_input_toplevel, vertex_index);
   } else if (rvalue->type->is_matrix()) {
      /* Matrices are packed/unpacked by considering each column vector in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->matrix_columns,
                                   fine_location, unpacked_var, name,
                                   false, vertex_index);
   } else if (rvalue->type->vector_elements * dmul +
              fine_location % 4 > 4) {
      /* This vector is going to be "double parked" across two varying slots,
       * so handle it as two separate assignments. For doubles, a dvec3/dvec4
       * can end up being spread over 3 slots. However the second splitting
       * will happen later, here we just always want to split into 2.
       */
      unsigned left_components, right_components;
      unsigned left_swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned right_swizzle_values[4] = { 0, 0, 0, 0 };
      char left_swizzle_name[4] = { 0, 0, 0, 0 };
      char right_swizzle_name[4] = { 0, 0, 0, 0 };

      left_components = 4 - fine_location % 4;
      if (rvalue->type->is_64bit()) {
         /* We might actually end up with 0 left components! */
         left_components /= 2;
      }
      right_components = rvalue->type->vector_elements - left_components;

      for (unsigned i = 0; i < left_components; i++) {
         left_swizzle_values[i] = i;
         left_swizzle_name[i] = "xyzw"[i];
      }
      for (unsigned i = 0; i < right_components; i++) {
         right_swizzle_values[i] = i + left_components;
         right_swizzle_name[i] = "xyzw"[i + left_components];
      }
      ir_swizzle *left_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue, left_swizzle_values, left_components);
      ir_swizzle *right_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue->clone(this->mem_ctx, NULL), right_swizzle_values,
                    right_components);
      char *left_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, left_swizzle_name);
      char *right_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, right_swizzle_name);
      if (left_components)
         fine_location = this->lower_rvalue(left_swizzle, fine_location,
                                            unpacked_var, left_name, false,
                                            vertex_index);
      else
         /* Top up the fine location to the next slot */
         fine_location++;
      return this->lower_rvalue(right_swizzle, fine_location, unpacked_var,
                                right_name, false, vertex_index);
   } else {
      /* No special handling is necessary; pack the rvalue into the
       * varying.
       */
      unsigned swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned components = rvalue->type->vector_elements * dmul;
      unsigned location = fine_location / 4;
      unsigned location_frac = fine_location % 4;
      for (unsigned i = 0; i < components; ++i)
         swizzle_values[i] = i + location_frac;
      ir_dereference *packed_deref =
         this->get_packed_varying_deref(location, unpacked_var, name,
                                        vertex_index);
      if (unpacked_var->data.stream != 0) {
         assert(unpacked_var->data.stream < 4);
         ir_variable *packed_var = packed_deref->variable_referenced();
         for (unsigned i = 0; i < components; ++i) {
            packed_var->data.stream |=
               unpacked_var->data.stream << (2 * (location_frac + i));
         }
      }
      ir_swizzle *swizzle = new(this->mem_ctx)
         ir_swizzle(packed_deref, swizzle_values, components);
      if (this->mode == ir_var_shader_out) {
         this->bitwise_assign_pack(swizzle, rvalue);
      } else {
         this->bitwise_assign_unpack(rvalue, swizzle);
      }
      return fine_location + components;
   }
}